

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

uv_loop_t * uv_default_loop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  
  puVar2 = default_loop_ptr;
  if (default_loop_ptr == (uv_loop_t *)0x0) {
    puVar2 = &default_loop_struct;
    iVar1 = uv__loop_init(&default_loop_struct,1);
    if (iVar1 == 0) {
      default_loop_ptr = &default_loop_struct;
    }
    else {
      puVar2 = (uv_loop_t *)0x0;
    }
  }
  return puVar2;
}

Assistant:

uv_loop_t* uv_default_loop(void) {
  if (default_loop_ptr != NULL)
    return default_loop_ptr;

  if (uv__loop_init(&default_loop_struct, /* default_loop? */ 1))
    return NULL;

  default_loop_ptr = &default_loop_struct;
  return default_loop_ptr;
}